

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  int iVar9;
  int *piVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  Layer *pLVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  _func_int *p_Var24;
  Allocator *pAVar25;
  Allocator *pAVar26;
  int iVar27;
  int iVar28;
  Allocator *pAVar29;
  _func_int ***ppp_Var30;
  _func_int *p_Var31;
  Allocator *pAVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  uint _w;
  uint uVar36;
  int iVar37;
  uint _h;
  undefined1 (*pauVar38) [32];
  size_t sVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  undefined1 (*pauVar43) [16];
  Allocator *pAVar44;
  uint uVar45;
  undefined1 auVar48 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [28];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar79 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar80 [16];
  undefined1 auVar103 [32];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  void *local_270;
  undefined1 local_218 [56];
  int local_1e0;
  size_t local_1d8;
  Allocator *local_1d0;
  Allocator *local_1c8;
  _func_int **local_1c0;
  Option opt_p;
  Mat local_168;
  long local_118;
  void *local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar7;
  undefined1 auVar54 [32];
  undefined1 auVar73 [32];
  undefined1 auVar97 [32];
  
  iVar34 = bottom_blob->w;
  iVar42 = bottom_blob->h;
  uVar41 = bottom_blob->elemsize;
  iVar9 = bottom_blob->elempack;
  p_Var24 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  if (opt->use_packing_layout == true) {
    uVar36 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var24) & 3) == 0) * 3 + 1;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var24) & 7) == 0) {
      uVar36 = 8;
    }
  }
  else {
    uVar36 = 1;
  }
  iVar27 = (*(int *)(&this->field_0xd4 + (long)p_Var24) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var24);
  iVar19 = *(int *)(&this->field_0xe4 + (long)p_Var24);
  iVar28 = (*(int *)(&this->field_0xd8 + (long)p_Var24) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var24);
  iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var24);
  iVar33 = *(int *)(&this->field_0xfc + (long)p_Var24);
  iVar37 = *(int *)(&this->field_0x100 + (long)p_Var24);
  uVar45 = bottom_blob->c;
  pAVar25 = (Allocator *)(ulong)uVar45;
  local_1d8 = 0;
  local_218._0_8_ = (Allocator *)0x0;
  local_218._8_4_ = 0;
  local_218._12_4_ = 0;
  local_218._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_218._24_4_ = 0;
  p_Var31 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  p_Var24 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_fma + (long)p_Var31);
  lVar35 = 0x10;
  local_218._32_8_ = local_218._0_8_;
  local_218._40_4_ = local_218._8_4_;
  local_218._44_4_ = local_218._12_4_;
  local_218._48_8_ = local_218._16_8_;
  local_1e0 = local_218._24_4_;
  if ((((*(int *)(&this->field_0xec + (long)p_Var31) < 1) && (*(int *)(p_Var24 + 0xf0) < 1)) &&
      (*(int *)(p_Var24 + 0xf4) < 1)) &&
     ((*(int *)(p_Var24 + 0xf8) < 1 &&
      ((*(int *)(p_Var24 + 0x104) < 1 || (*(int *)(p_Var24 + 0x108) < 1)))))) {
    if ((Mat *)local_218 != top_blob) {
      piVar10 = top_blob->refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_218._0_8_ = top_blob->data;
      local_218._8_4_ = SUB84(top_blob->refcount,0);
      local_218._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_218._16_8_ = top_blob->elemsize;
      local_218._24_4_ = top_blob->elempack;
      local_218._32_8_ = top_blob->allocator;
      uVar4 = top_blob->dims;
      uVar5 = top_blob->w;
      uVar6 = top_blob->h;
      uVar8 = top_blob->d;
      uVar7 = CONCAT44(uVar8,uVar6);
      local_1e0 = top_blob->c;
      local_1d8 = top_blob->cstep;
      p_Var31 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
      local_218._40_4_ = uVar4;
      local_218._44_4_ = uVar5;
      local_218._48_8_ = uVar7;
    }
    p_Var24 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_fma + (long)p_Var31);
    lVar35 = 8;
  }
  _w = iVar33 + (iVar34 + -1) * iVar19 + iVar27 + 1;
  _h = iVar37 + (iVar42 + -1) * iVar18 + iVar28 + 1;
  sVar39 = (uVar41 / (ulong)(long)iVar9) * (ulong)uVar36;
  Mat::create((Mat *)local_218,_w,_h,*(int *)(p_Var24 + 0xd0) / (int)uVar36,sVar39,uVar36,
              *(Allocator **)(&opt->lightmode + lVar35));
  if (((Allocator *)local_218._0_8_ != (Allocator *)0x0) && ((long)local_1e0 * local_1d8 != 0)) {
    p_Var24 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
    iVar18 = iVar9 * uVar45;
    iVar19 = *(int *)(&this->field_0x114 + (long)p_Var24);
    if ((iVar18 == iVar19) && (iVar18 == *(int *)(&this->field_0xd0 + (long)p_Var24))) {
      iVar19 = *(int *)(&this->field_0xd8 + (long)p_Var24) *
               *(int *)(&this->field_0xd4 + (long)p_Var24);
      if (iVar9 == 1) {
        if ((int)_w < 1) {
          _w = 0;
        }
        pAVar32 = (Allocator *)0x0;
        pAVar44 = (Allocator *)(ulong)_h;
        if ((int)_h < 1) {
          pAVar44 = pAVar32;
        }
        if ((int)uVar45 < 1) {
          pAVar25 = pAVar32;
        }
        local_1c8 = (Allocator *)local_218._0_8_;
        local_1d0 = (Allocator *)(local_1d8 * local_218._16_8_);
        local_270 = (this->weight_data_tm).data;
        iVar9 = bottom_blob->w;
        local_110 = bottom_blob->data;
        sVar39 = bottom_blob->elemsize;
        local_118 = bottom_blob->cstep * sVar39;
        for (; pvVar12 = local_110, pAVar32 != pAVar25;
            pAVar32 = (Allocator *)((long)&pAVar32->_vptr_Allocator + 1)) {
          ppp_Var30 = (_func_int ***)
                      ((long)&local_1c8->_vptr_Allocator + (long)local_1d0 * (long)pAVar32);
          lVar35 = local_118 * (long)pAVar32;
          for (iVar18 = 0; iVar18 != (int)pAVar44; iVar18 = iVar18 + 1) {
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
            for (uVar36 = 0; uVar36 != _w; uVar36 = uVar36 + 1) {
              p_Var24 = local_1c0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var24) == 0) {
                auVar107 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar107 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                            (long)pAVar32 * 4));
              }
              iVar37 = 0;
              iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var24);
              if (*(int *)(&this->field_0xd8 + (long)p_Var24) < 1) {
                iVar33 = iVar37;
              }
              for (; iVar37 != iVar33; iVar37 = iVar37 + 1) {
                iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var24) * iVar37 + (iVar18 - iVar28);
                if (((-1 < iVar20) &&
                    (iVar21 = iVar20 / *(int *)(&this->field_0xe8 + (long)p_Var24),
                    iVar20 % *(int *)(&this->field_0xe8 + (long)p_Var24) == 0)) && (iVar21 < iVar42)
                   ) {
                  uVar45 = *(uint *)(&this->field_0xd4 + (long)p_Var24);
                  uVar41 = 0;
                  if (0 < (int)uVar45) {
                    uVar41 = (ulong)uVar45;
                  }
                  for (uVar40 = 0; uVar41 != uVar40; uVar40 = uVar40 + 1) {
                    iVar20 = *(int *)(&this->field_0xdc + (long)p_Var24) * (int)uVar40 +
                             (uVar36 - iVar27);
                    if (((-1 < iVar20) &&
                        (iVar22 = iVar20 / *(int *)(&this->field_0xe4 + (long)p_Var24),
                        iVar20 % *(int *)(&this->field_0xe4 + (long)p_Var24) == 0)) &&
                       (iVar22 < iVar34)) {
                      auVar79 = vfmadd231ss_fma(auVar107._0_16_,
                                                ZEXT416(*(uint *)((long)local_270 +
                                                                 uVar40 * 4 +
                                                                 (long)(int)(uVar45 * iVar37) * 4)),
                                                ZEXT416(*(uint *)((long)pvVar12 +
                                                                 (long)iVar22 * 4 +
                                                                 (long)iVar21 * (long)iVar9 * sVar39
                                                                 + lVar35)));
                      auVar107 = ZEXT1664(auVar79);
                    }
                  }
                }
              }
              auVar79 = auVar107._0_16_;
              fVar46 = auVar107._0_4_;
              fVar47 = fVar46;
              switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var24)) {
              case 1:
                auVar79 = vmaxss_avx(auVar79,ZEXT416(0));
                fVar47 = auVar79._0_4_;
                break;
              case 2:
                auVar79 = vcmpss_avx(ZEXT816(0) << 0x40,auVar79,1);
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = 0x3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar79 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var24)),
                                        auVar95,auVar79);
                fVar47 = auVar79._0_4_ * fVar46;
                break;
              case 3:
                fVar46 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var24))[1];
                auVar79 = vmaxss_avx(auVar79,ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var24)
                                                    ));
                fVar47 = auVar79._0_4_;
                if (fVar46 < auVar79._0_4_) {
                  fVar47 = fVar46;
                }
                break;
              case 4:
                auVar79 = vminss_avx(auVar79,ZEXT416(0x42b0c0a5));
                auVar151._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar151._8_4_ = auVar79._8_4_ ^ 0x80000000;
                auVar151._12_4_ = auVar79._12_4_ ^ 0x80000000;
                auVar79 = vcmpss_avx(auVar79,ZEXT416(0xc2b0c0a5),1);
                auVar61._8_4_ = 0x42b0c0a5;
                auVar61._0_8_ = 0x42b0c0a542b0c0a5;
                auVar61._12_4_ = 0x42b0c0a5;
                auVar79 = vblendvps_avx(auVar151,auVar61,auVar79);
                fVar47 = expf(auVar79._0_4_);
                fVar47 = 1.0 / (fVar47 + 1.0);
                break;
              case 5:
                fVar47 = expf(fVar46);
                fVar47 = logf(fVar47 + 1.0);
                fVar47 = tanhf(fVar47);
                fVar47 = fVar47 * fVar46;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0x120 + (long)p_Var24);
                fVar3 = (*(float **)(&this->field_0x120 + (long)p_Var24))[1];
                fVar104 = -fVar3 / fVar2;
                fVar47 = 0.0;
                if ((fVar104 <= fVar46) && (fVar47 = fVar46, fVar46 <= fVar104 + 1.0 / fVar2)) {
                  auVar79 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar79,ZEXT416((uint)fVar3));
                  fVar47 = auVar79._0_4_ * fVar46;
                }
              }
              *(float *)ppp_Var30 = fVar47;
              ppp_Var30 = (_func_int ***)((long)ppp_Var30 + 4);
            }
          }
          local_270 = (void *)((long)local_270 + (long)iVar19 * 4);
        }
      }
      else if (iVar9 == 4) {
        if ((int)_w < 1) {
          _w = 0;
        }
        if ((int)_h < 1) {
          _h = 0;
        }
        if ((int)uVar45 < 1) {
          pAVar25 = (Allocator *)0x0;
        }
        auVar120 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar107 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar79._8_4_ = 0xc2b0c0a5;
        auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar79._12_4_ = 0xc2b0c0a5;
        auVar173._8_4_ = 0x3ab743ce;
        auVar173._0_8_ = 0x3ab743ce3ab743ce;
        auVar173._12_4_ = 0x3ab743ce;
        pAVar44 = (Allocator *)0x0;
        pAVar32 = (Allocator *)0x0;
        while (pAVar29 = pAVar32, pAVar26 = pAVar44, pAVar26 != pAVar25) {
          iVar18 = (int)pAVar29;
          ppp_Var30 = (_func_int ***)
                      ((long)(_func_int ***)local_218._0_8_ +
                      local_1d8 * (long)pAVar26 * local_218._16_8_);
          iVar9 = bottom_blob->w;
          sVar39 = bottom_blob->cstep;
          sVar11 = bottom_blob->elemsize;
          pvVar12 = bottom_blob->data;
          pvVar13 = (this->weight_data_tm).data;
          for (uVar36 = 0; uVar36 != _h; uVar36 = uVar36 + 1) {
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
            for (uVar45 = 0; uVar45 != _w; uVar45 = uVar45 + 1) {
              p_Var24 = local_1c0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var24) == 0) {
                auVar151 = ZEXT816(0) << 0x40;
              }
              else {
                auVar151 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1b0 + (long)p_Var24) + (long)pAVar26 * 0x10);
              }
              auVar140 = ZEXT1664(auVar151);
              iVar37 = 0;
              iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var24);
              if (*(int *)(&this->field_0xd8 + (long)p_Var24) < 1) {
                iVar33 = iVar37;
              }
              for (; iVar37 != iVar33; iVar37 = iVar37 + 1) {
                iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var24) * iVar37 + (uVar36 - iVar28);
                if (((-1 < iVar20) &&
                    (iVar21 = iVar20 / *(int *)(&this->field_0xe8 + (long)p_Var24),
                    iVar20 % *(int *)(&this->field_0xe8 + (long)p_Var24) == 0)) && (iVar21 < iVar42)
                   ) {
                  uVar23 = *(uint *)(&this->field_0xd4 + (long)p_Var24);
                  uVar41 = 0;
                  if (0 < (int)uVar23) {
                    uVar41 = (ulong)uVar23;
                  }
                  pauVar43 = (undefined1 (*) [16])
                             ((long)pvVar13 + (long)(int)(uVar23 * iVar37) * 0x10 + (long)iVar18 * 4
                             );
                  for (uVar40 = 0; uVar41 != uVar40; uVar40 = uVar40 + 1) {
                    iVar20 = *(int *)(&this->field_0xdc + (long)p_Var24) * (int)uVar40 +
                             (uVar45 - iVar27);
                    if (((-1 < iVar20) &&
                        (iVar22 = iVar20 / *(int *)(&this->field_0xe4 + (long)p_Var24),
                        iVar20 % *(int *)(&this->field_0xe4 + (long)p_Var24) == 0)) &&
                       (iVar22 < iVar34)) {
                      auVar151 = vfmadd231ps_fma(auVar140._0_16_,
                                                 *(undefined1 (*) [16])
                                                  ((long)pvVar12 +
                                                  (long)(iVar22 << 2) * 4 +
                                                  (long)iVar21 * (long)iVar9 * sVar11 +
                                                  sVar39 * (long)pAVar26 * sVar11),*pauVar43);
                      auVar140 = ZEXT1664(auVar151);
                    }
                    pauVar43 = pauVar43 + 1;
                  }
                }
              }
              auVar151 = auVar140._0_16_;
              auVar59 = auVar151;
              if (*(int *)(&this->field_0x118 + (long)p_Var24) - 1U < 6) {
                auVar59 = vmaxps_avx(auVar151,_DAT_004ee060);
                auVar61 = auVar107._0_16_;
                auVar95 = auVar120._0_16_;
                switch(*(int *)(&this->field_0x118 + (long)p_Var24)) {
                case 2:
                  auVar151 = vminps_avx(auVar151,_DAT_004ee060);
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                  auVar145._4_4_ = uVar1;
                  auVar145._0_4_ = uVar1;
                  auVar145._8_4_ = uVar1;
                  auVar145._12_4_ = uVar1;
                  auVar59 = vfmadd231ps_fma(auVar59,auVar151,auVar145);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var24))[1];
                  auVar148._4_4_ = uVar1;
                  auVar148._0_4_ = uVar1;
                  auVar148._8_4_ = uVar1;
                  auVar148._12_4_ = uVar1;
                  auVar151 = vmaxps_avx(auVar151,auVar62);
                  auVar59 = vminps_avx(auVar148,auVar151);
                  break;
                case 4:
                  auVar63._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                  auVar63._8_4_ = -auVar140._8_4_;
                  auVar63._12_4_ = -auVar140._12_4_;
                  auVar86._8_4_ = 0x42b0c0a5;
                  auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar86._12_4_ = 0x42b0c0a5;
                  auVar151 = vminps_avx(auVar63,auVar86);
                  auVar87._8_4_ = 0xc2b0c0a5;
                  auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar87._12_4_ = 0xc2b0c0a5;
                  auVar146 = vmaxps_avx(auVar151,auVar87);
                  auVar149._8_4_ = 0x3fb8aa3b;
                  auVar149._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar149._12_4_ = 0x3fb8aa3b;
                  auVar151 = vfmadd213ps_fma(auVar149,auVar146,auVar95);
                  auVar178._0_4_ = (int)auVar151._0_4_;
                  auVar178._4_4_ = (int)auVar151._4_4_;
                  auVar178._8_4_ = (int)auVar151._8_4_;
                  auVar178._12_4_ = (int)auVar151._12_4_;
                  auVar59 = vcvtdq2ps_avx(auVar178);
                  auVar151 = vcmpps_avx(auVar151,auVar59,1);
                  auVar151 = vandps_avx(auVar151,auVar61);
                  auVar151 = vsubps_avx(auVar59,auVar151);
                  auVar88._8_4_ = 0x3f318000;
                  auVar88._0_8_ = 0x3f3180003f318000;
                  auVar88._12_4_ = 0x3f318000;
                  auVar59 = vfmsub231ps_fma(auVar146,auVar151,auVar88);
                  auVar89._8_4_ = 0x395e8083;
                  auVar89._0_8_ = 0x395e8083395e8083;
                  auVar89._12_4_ = 0x395e8083;
                  auVar146 = vfmsub231ps_fma(auVar59,auVar151,auVar89);
                  auVar179._0_4_ = auVar146._0_4_ * auVar146._0_4_;
                  auVar179._4_4_ = auVar146._4_4_ * auVar146._4_4_;
                  auVar179._8_4_ = auVar146._8_4_ * auVar146._8_4_;
                  auVar179._12_4_ = auVar146._12_4_ * auVar146._12_4_;
                  auVar162._8_4_ = 0x39506967;
                  auVar162._0_8_ = 0x3950696739506967;
                  auVar162._12_4_ = 0x39506967;
                  auVar90._8_4_ = 0x3ab743ce;
                  auVar90._0_8_ = 0x3ab743ce3ab743ce;
                  auVar90._12_4_ = 0x3ab743ce;
                  auVar59 = vfmadd213ps_fma(auVar162,auVar146,auVar90);
                  auVar91._8_4_ = 0x3c088908;
                  auVar91._0_8_ = 0x3c0889083c088908;
                  auVar91._12_4_ = 0x3c088908;
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar91);
                  auVar92._8_4_ = 0x3d2aa9c1;
                  auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar92._12_4_ = 0x3d2aa9c1;
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar92);
                  auVar93._8_4_ = 0x3e2aaaaa;
                  auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar93._12_4_ = 0x3e2aaaaa;
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar93);
                  auVar95 = vfmadd213ps_fma(auVar59,auVar146,auVar95);
                  auVar95 = vfmadd213ps_fma(auVar95,auVar179,auVar146);
                  auVar163._0_4_ = auVar95._0_4_ + auVar107._0_4_;
                  auVar163._4_4_ = auVar95._4_4_ + auVar107._4_4_;
                  auVar163._8_4_ = auVar95._8_4_ + auVar107._8_4_;
                  auVar163._12_4_ = auVar95._12_4_ + auVar107._12_4_;
                  auVar64._0_4_ = (int)auVar151._0_4_;
                  auVar64._4_4_ = (int)auVar151._4_4_;
                  auVar64._8_4_ = (int)auVar151._8_4_;
                  auVar64._12_4_ = (int)auVar151._12_4_;
                  auVar151 = vpslld_avx(auVar64,0x17);
                  auVar151 = vpaddd_avx(auVar151,auVar61);
                  auVar95 = vfmadd213ps_fma(auVar151,auVar163,auVar61);
                  auVar151 = vrcpps_avx(auVar95);
                  auVar61 = vfmsub213ps_fma(auVar95,auVar151,auVar61);
                  auVar59 = vfnmadd132ps_fma(auVar61,auVar151,auVar151);
                  break;
                case 5:
                  auVar166._8_4_ = 0x42b0c0a5;
                  auVar166._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar166._12_4_ = 0x42b0c0a5;
                  auVar59 = vminps_avx(auVar151,auVar166);
                  auVar94 = vmaxps_avx(auVar79,auVar59);
                  auVar171._8_4_ = 0x3fb8aa3b;
                  auVar171._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar171._12_4_ = 0x3fb8aa3b;
                  auVar59 = vfmadd213ps_fma(auVar171,auVar94,auVar95);
                  auVar158._0_4_ = (int)auVar59._0_4_;
                  auVar158._4_4_ = (int)auVar59._4_4_;
                  auVar158._8_4_ = (int)auVar59._8_4_;
                  auVar158._12_4_ = (int)auVar59._12_4_;
                  auVar146 = vcvtdq2ps_avx(auVar158);
                  auVar59 = vcmpps_avx(auVar59,auVar146,1);
                  auVar59 = vandps_avx(auVar59,auVar61);
                  auVar59 = vsubps_avx(auVar146,auVar59);
                  auVar49._8_4_ = 0x3f318000;
                  auVar49._0_8_ = 0x3f3180003f318000;
                  auVar49._12_4_ = 0x3f318000;
                  auVar146 = vfmsub231ps_fma(auVar94,auVar59,auVar49);
                  auVar81._8_4_ = 0xb95e8083;
                  auVar81._0_8_ = 0xb95e8083b95e8083;
                  auVar81._12_4_ = 0xb95e8083;
                  auVar94 = vfnmsub231ps_fma(auVar146,auVar59,auVar81);
                  auVar159._0_4_ = auVar94._0_4_ * auVar94._0_4_;
                  auVar159._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                  auVar159._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                  auVar159._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                  auVar167._8_4_ = 0x39506967;
                  auVar167._0_8_ = 0x3950696739506967;
                  auVar167._12_4_ = 0x39506967;
                  auVar146 = vfmadd213ps_fma(auVar167,auVar94,auVar173);
                  auVar105._8_4_ = 0x3c088908;
                  auVar105._0_8_ = 0x3c0889083c088908;
                  auVar105._12_4_ = 0x3c088908;
                  auVar146 = vfmadd213ps_fma(auVar146,auVar94,auVar105);
                  auVar141._8_4_ = 0x3d2aa9c1;
                  auVar141._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar141._12_4_ = 0x3d2aa9c1;
                  auVar146 = vfmadd213ps_fma(auVar146,auVar94,auVar141);
                  auVar108._8_4_ = 0x3e2aaaaa;
                  auVar108._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar108._12_4_ = 0x3e2aaaaa;
                  auVar146 = vfmadd213ps_fma(auVar146,auVar94,auVar108);
                  auVar146 = vfmadd213ps_fma(auVar146,auVar94,auVar95);
                  auVar146 = vfmadd213ps_fma(auVar146,auVar159,auVar94);
                  auVar82._0_4_ = auVar146._0_4_ + auVar107._0_4_;
                  auVar82._4_4_ = auVar146._4_4_ + auVar107._4_4_;
                  auVar82._8_4_ = auVar146._8_4_ + auVar107._8_4_;
                  auVar82._12_4_ = auVar146._12_4_ + auVar107._12_4_;
                  auVar58._0_4_ = (int)auVar59._0_4_;
                  auVar58._4_4_ = (int)auVar59._4_4_;
                  auVar58._8_4_ = (int)auVar59._8_4_;
                  auVar58._12_4_ = (int)auVar59._12_4_;
                  auVar59 = vpslld_avx(auVar58,0x17);
                  auVar59 = vpaddd_avx(auVar59,auVar61);
                  auVar51 = vfmadd213ps_fma(auVar59,auVar82,auVar61);
                  auVar83._8_4_ = 0x800000;
                  auVar83._0_8_ = 0x80000000800000;
                  auVar83._12_4_ = 0x800000;
                  auVar59 = vmaxps_avx(auVar51,auVar83);
                  auVar146 = vpsrld_avx(auVar59,0x17);
                  auVar109._8_4_ = 0xffffff82;
                  auVar109._0_8_ = 0xffffff82ffffff82;
                  auVar109._12_4_ = 0xffffff82;
                  auVar146 = vpaddd_avx(auVar146,auVar109);
                  auVar110._8_4_ = 0x807fffff;
                  auVar110._0_8_ = 0x807fffff807fffff;
                  auVar110._12_4_ = 0x807fffff;
                  auVar59 = vandps_avx(auVar59,auVar110);
                  auVar50 = vorps_avx(auVar59,auVar95);
                  auVar94 = vcvtdq2ps_avx(auVar146);
                  auVar111._8_4_ = 0x3f3504f3;
                  auVar111._0_8_ = 0x3f3504f33f3504f3;
                  auVar111._12_4_ = 0x3f3504f3;
                  auVar146 = vcmpps_avx(auVar50,auVar111,1);
                  auVar59 = vandps_avx(auVar146,auVar50);
                  auVar84._0_4_ = auVar50._0_4_ + -1.0 + auVar59._0_4_;
                  auVar84._4_4_ = auVar50._4_4_ + -1.0 + auVar59._4_4_;
                  auVar84._8_4_ = auVar50._8_4_ + -1.0 + auVar59._8_4_;
                  auVar84._12_4_ = auVar50._12_4_ + -1.0 + auVar59._12_4_;
                  auVar61 = vandps_avx(auVar146,auVar61);
                  auVar59 = vsubps_avx(auVar94,auVar61);
                  auVar147._0_4_ = auVar84._0_4_ * auVar84._0_4_;
                  auVar147._4_4_ = auVar84._4_4_ * auVar84._4_4_;
                  auVar147._8_4_ = auVar84._8_4_ * auVar84._8_4_;
                  auVar147._12_4_ = auVar84._12_4_ * auVar84._12_4_;
                  auVar160._8_4_ = 0x3d9021bb;
                  auVar160._0_8_ = 0x3d9021bb3d9021bb;
                  auVar160._12_4_ = 0x3d9021bb;
                  auVar122._8_4_ = 0xbdebd1b8;
                  auVar122._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar122._12_4_ = 0xbdebd1b8;
                  auVar61 = vfmadd213ps_fma(auVar160,auVar84,auVar122);
                  auVar123._8_4_ = 0x3def251a;
                  auVar123._0_8_ = 0x3def251a3def251a;
                  auVar123._12_4_ = 0x3def251a;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar123);
                  auVar124._8_4_ = 0xbdfe5d4f;
                  auVar124._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar124._12_4_ = 0xbdfe5d4f;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar124);
                  auVar125._8_4_ = 0x3e11e9bf;
                  auVar125._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar125._12_4_ = 0x3e11e9bf;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar125);
                  auVar126._8_4_ = 0xbe2aae50;
                  auVar126._0_8_ = 0xbe2aae50be2aae50;
                  auVar126._12_4_ = 0xbe2aae50;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar126);
                  auVar127._8_4_ = 0x3e4cceac;
                  auVar127._0_8_ = 0x3e4cceac3e4cceac;
                  auVar127._12_4_ = 0x3e4cceac;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar127);
                  auVar128._8_4_ = 0xbe7ffffc;
                  auVar128._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar128._12_4_ = 0xbe7ffffc;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar128);
                  auVar129._8_4_ = 0x3eaaaaaa;
                  auVar129._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar129._12_4_ = 0x3eaaaaaa;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar84,auVar129);
                  auVar152._0_4_ = auVar147._0_4_ * auVar84._0_4_ * auVar61._0_4_;
                  auVar152._4_4_ = auVar147._4_4_ * auVar84._4_4_ * auVar61._4_4_;
                  auVar152._8_4_ = auVar147._8_4_ * auVar84._8_4_ * auVar61._8_4_;
                  auVar152._12_4_ = auVar147._12_4_ * auVar84._12_4_ * auVar61._12_4_;
                  auVar161._8_4_ = 0xb95e8083;
                  auVar161._0_8_ = 0xb95e8083b95e8083;
                  auVar161._12_4_ = 0xb95e8083;
                  auVar61 = vfmadd231ps_fma(auVar152,auVar59,auVar161);
                  auVar146 = vfmsub231ps_fma(auVar61,auVar95,auVar147);
                  auVar61 = vcmpps_avx(auVar51,ZEXT816(0) << 0x20,2);
                  auVar146 = vsubps_avx(auVar146,auVar84);
                  auVar168._8_4_ = 0x42b0c0a5;
                  auVar168._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar168._12_4_ = 0x42b0c0a5;
                  auVar142._8_4_ = 0x3f800000;
                  auVar142._0_8_ = 0x3f8000003f800000;
                  auVar142._12_4_ = 0x3f800000;
                  auVar59 = vfnmadd231ps_fma(auVar146,auVar49,auVar59);
                  auVar85._0_4_ = auVar59._0_4_ + auVar59._0_4_;
                  auVar85._4_4_ = auVar59._4_4_ + auVar59._4_4_;
                  auVar85._8_4_ = auVar59._8_4_ + auVar59._8_4_;
                  auVar85._12_4_ = auVar59._12_4_ + auVar59._12_4_;
                  auVar112._8_4_ = 0x7fffffff;
                  auVar112._0_8_ = 0x7fffffff7fffffff;
                  auVar112._12_4_ = 0x7fffffff;
                  auVar61 = vblendvps_avx(auVar85,auVar112,auVar61);
                  auVar61 = vminps_avx(auVar168,auVar61);
                  auVar146 = vmaxps_avx(auVar79,auVar61);
                  auVar61 = vfmadd213ps_fma(auVar171,auVar146,auVar95);
                  auVar113._0_4_ = (int)auVar61._0_4_;
                  auVar113._4_4_ = (int)auVar61._4_4_;
                  auVar113._8_4_ = (int)auVar61._8_4_;
                  auVar113._12_4_ = (int)auVar61._12_4_;
                  auVar59 = vcvtdq2ps_avx(auVar113);
                  auVar61 = vcmpps_avx(auVar61,auVar59,1);
                  auVar61 = vandps_avx(auVar61,auVar142);
                  auVar61 = vsubps_avx(auVar59,auVar61);
                  auVar59 = vfmsub231ps_fma(auVar146,auVar61,auVar49);
                  auVar50._8_4_ = 0xb95e8083;
                  auVar50._0_8_ = 0xb95e8083b95e8083;
                  auVar50._12_4_ = 0xb95e8083;
                  auVar146 = vfnmsub231ps_fma(auVar59,auVar61,auVar50);
                  auVar114._0_4_ = auVar146._0_4_ * auVar146._0_4_;
                  auVar114._4_4_ = auVar146._4_4_ * auVar146._4_4_;
                  auVar114._8_4_ = auVar146._8_4_ * auVar146._8_4_;
                  auVar114._12_4_ = auVar146._12_4_ * auVar146._12_4_;
                  auVar59 = vfmadd213ps_fma(auVar167,auVar146,auVar173);
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar105);
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar141);
                  auVar51._8_4_ = 0x3e2aaaaa;
                  auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar51._12_4_ = 0x3e2aaaaa;
                  auVar59 = vfmadd213ps_fma(auVar59,auVar146,auVar51);
                  auVar120 = ZEXT1664(auVar95);
                  auVar95 = vfmadd213ps_fma(auVar59,auVar146,auVar95);
                  auVar95 = vfmadd213ps_fma(auVar95,auVar114,auVar146);
                  auVar115._0_4_ = auVar95._0_4_ + 1.0;
                  auVar115._4_4_ = auVar95._4_4_ + 1.0;
                  auVar115._8_4_ = auVar95._8_4_ + 1.0;
                  auVar115._12_4_ = auVar95._12_4_ + 1.0;
                  auVar60._0_4_ = (int)auVar61._0_4_;
                  auVar60._4_4_ = (int)auVar61._4_4_;
                  auVar60._8_4_ = (int)auVar61._8_4_;
                  auVar60._12_4_ = (int)auVar61._12_4_;
                  auVar61 = vpslld_avx(auVar60,0x17);
                  auVar61 = vpaddd_avx(auVar61,auVar142);
                  auVar107 = ZEXT1664(auVar142);
                  auVar95 = vfmadd213ps_fma(auVar61,auVar115,auVar142);
                  auVar61 = vrcpps_avx(auVar95);
                  auVar116._0_4_ = auVar61._0_4_ + auVar61._0_4_;
                  auVar116._4_4_ = auVar61._4_4_ + auVar61._4_4_;
                  auVar116._8_4_ = auVar61._8_4_ + auVar61._8_4_;
                  auVar116._12_4_ = auVar61._12_4_ + auVar61._12_4_;
                  auVar106._8_4_ = 0x40000000;
                  auVar106._0_8_ = 0x4000000040000000;
                  auVar106._12_4_ = 0x40000000;
                  auVar95 = vfmsub213ps_fma(auVar95,auVar116,auVar106);
                  auVar61 = vfnmadd213ps_fma(auVar95,auVar61,auVar116);
                  auVar59 = vfmsub213ps_fma(auVar61,auVar151,auVar151);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                  auVar146._4_4_ = uVar1;
                  auVar146._0_4_ = uVar1;
                  auVar146._8_4_ = uVar1;
                  auVar146._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var24))[1];
                  auVar94._4_4_ = uVar1;
                  auVar94._0_4_ = uVar1;
                  auVar94._8_4_ = uVar1;
                  auVar94._12_4_ = uVar1;
                  auVar151 = vfmadd231ps_fma(auVar94,auVar151,auVar146);
                  auVar151 = vmaxps_avx(auVar151,_DAT_004ee060);
                  auVar151 = vminps_avx(auVar151,auVar61);
                  auVar59._0_4_ = auVar140._0_4_ * auVar151._0_4_;
                  auVar59._4_4_ = auVar140._4_4_ * auVar151._4_4_;
                  auVar59._8_4_ = auVar140._8_4_ * auVar151._8_4_;
                  auVar59._12_4_ = auVar140._12_4_ * auVar151._12_4_;
                }
              }
              *(undefined1 (*) [16])ppp_Var30 = auVar59;
              ppp_Var30 = ppp_Var30 + 2;
            }
          }
          pAVar32 = (Allocator *)(ulong)(uint)(iVar18 + iVar19 * 4);
          local_1d0 = pAVar26;
          local_1c8 = pAVar29;
          pAVar44 = (Allocator *)((long)&pAVar26->_vptr_Allocator + 1);
        }
      }
      else if (iVar9 == 8) {
        if ((int)_w < 1) {
          _w = 0;
        }
        if ((int)_h < 1) {
          _h = 0;
        }
        if ((int)uVar45 < 1) {
          pAVar25 = (Allocator *)0x0;
        }
        auVar169 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar107 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar170 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar120 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar143 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar150 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar144 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar181 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                      CONCAT424(0x3d2aa9c1,
                                                CONCAT420(0x3d2aa9c1,
                                                          CONCAT416(0x3d2aa9c1,
                                                                    CONCAT412(0x3d2aa9c1,
                                                                              CONCAT48(0x3d2aa9c1,
                                                                                                                                                                              
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar140 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
        pAVar44 = (Allocator *)0x0;
        pAVar32 = (Allocator *)0x0;
        while (pAVar29 = pAVar32, pAVar26 = pAVar44, pAVar26 != pAVar25) {
          iVar18 = (int)pAVar29;
          ppp_Var30 = (_func_int ***)
                      ((long)(_func_int ***)local_218._0_8_ +
                      local_1d8 * (long)pAVar26 * local_218._16_8_);
          iVar9 = bottom_blob->w;
          sVar39 = bottom_blob->cstep;
          sVar11 = bottom_blob->elemsize;
          pvVar12 = bottom_blob->data;
          pvVar13 = (this->weight_data_tm).data;
          for (uVar36 = 0; uVar36 != _h; uVar36 = uVar36 + 1) {
            local_1c0 = this->_vptr_DeconvolutionDepthWise_x86_fma;
            for (uVar45 = 0; uVar45 != _w; uVar45 = uVar45 + 1) {
              p_Var24 = local_1c0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var24) == 0) {
                auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar56 = ZEXT3264(*(undefined1 (*) [32])
                                    (*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                    (long)pAVar26 * 0x20));
              }
              iVar37 = 0;
              iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var24);
              if (*(int *)(&this->field_0xd8 + (long)p_Var24) < 1) {
                iVar33 = iVar37;
              }
              for (; iVar37 != iVar33; iVar37 = iVar37 + 1) {
                iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var24) * iVar37 + (uVar36 - iVar28);
                if (((-1 < iVar20) &&
                    (iVar21 = iVar20 / *(int *)(&this->field_0xe8 + (long)p_Var24),
                    iVar20 % *(int *)(&this->field_0xe8 + (long)p_Var24) == 0)) && (iVar21 < iVar42)
                   ) {
                  uVar23 = *(uint *)(&this->field_0xd4 + (long)p_Var24);
                  uVar41 = 0;
                  if (0 < (int)uVar23) {
                    uVar41 = (ulong)uVar23;
                  }
                  pauVar38 = (undefined1 (*) [32])
                             ((long)pvVar13 + (long)(int)(uVar23 * iVar37) * 0x20 + (long)iVar18 * 4
                             );
                  for (uVar40 = 0; uVar41 != uVar40; uVar40 = uVar40 + 1) {
                    iVar20 = *(int *)(&this->field_0xdc + (long)p_Var24) * (int)uVar40 +
                             (uVar45 - iVar27);
                    if (((-1 < iVar20) &&
                        (iVar22 = iVar20 / *(int *)(&this->field_0xe4 + (long)p_Var24),
                        iVar20 % *(int *)(&this->field_0xe4 + (long)p_Var24) == 0)) &&
                       (iVar22 < iVar34)) {
                      auVar79 = vfmadd231ps_fma(auVar56._0_32_,
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 (long)(iVar22 << 3) * 4 +
                                                 (long)iVar21 * (long)iVar9 * sVar11 +
                                                 sVar39 * (long)pAVar26 * sVar11),*pauVar38);
                      auVar56 = ZEXT1664(auVar79);
                    }
                    pauVar38 = pauVar38 + 1;
                  }
                }
              }
              auVar53 = auVar56._0_32_;
              auVar175 = auVar53;
              if (5 < *(int *)(&this->field_0x118 + (long)p_Var24) - 1U)
              goto switchD_003dae16_caseD_1;
              auVar68 = auVar155._0_32_;
              auVar175 = vmaxps_avx(auVar68,auVar53);
              auVar72 = auVar120._0_32_;
              auVar103 = auVar143._0_32_;
              auVar100 = auVar169._0_32_;
              auVar101 = auVar170._0_32_;
              auVar77 = auVar107._0_32_;
              auVar74 = auVar150._0_32_;
              auVar119 = auVar172._0_32_;
              auVar73 = auVar144._0_32_;
              switch(*(int *)(&this->field_0x118 + (long)p_Var24)) {
              case 2:
                auVar53 = vminps_avx(auVar68,auVar53);
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                auVar66._4_4_ = uVar1;
                auVar66._0_4_ = uVar1;
                auVar66._8_4_ = uVar1;
                auVar66._12_4_ = uVar1;
                auVar66._16_4_ = uVar1;
                auVar66._20_4_ = uVar1;
                auVar66._24_4_ = uVar1;
                auVar66._28_4_ = uVar1;
                auVar79 = vfmadd231ps_fma(auVar175,auVar53,auVar66);
                auVar175 = ZEXT1632(auVar79);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                auVar75._4_4_ = uVar1;
                auVar75._0_4_ = uVar1;
                auVar75._8_4_ = uVar1;
                auVar75._12_4_ = uVar1;
                auVar75._16_4_ = uVar1;
                auVar75._20_4_ = uVar1;
                auVar75._24_4_ = uVar1;
                auVar75._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var24))[1];
                auVar176._4_4_ = uVar1;
                auVar176._0_4_ = uVar1;
                auVar176._8_4_ = uVar1;
                auVar176._12_4_ = uVar1;
                auVar176._16_4_ = uVar1;
                auVar176._20_4_ = uVar1;
                auVar176._24_4_ = uVar1;
                auVar176._28_4_ = uVar1;
                auVar175 = vmaxps_avx(auVar53,auVar75);
                auVar175 = vminps_avx(auVar176,auVar175);
                break;
              case 4:
                auVar52._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
                auVar52._8_4_ = -auVar56._8_4_;
                auVar52._12_4_ = -auVar56._12_4_;
                auVar52._16_4_ = -auVar56._16_4_;
                auVar52._20_4_ = -auVar56._20_4_;
                auVar52._24_4_ = -auVar56._24_4_;
                auVar52._28_4_ = auVar56._28_4_ ^ 0x80000000;
                auVar76._8_4_ = 0x42b0c0a5;
                auVar76._0_8_ = 0x42b0c0a542b0c0a5;
                auVar76._12_4_ = 0x42b0c0a5;
                auVar76._16_4_ = 0x42b0c0a5;
                auVar76._20_4_ = 0x42b0c0a5;
                auVar76._24_4_ = 0x42b0c0a5;
                auVar76._28_4_ = 0x42b0c0a5;
                auVar175 = vminps_avx(auVar52,auVar76);
                auVar53 = vmaxps_avx(auVar100,auVar175);
                auVar79 = vfmadd213ps_fma(auVar101,auVar53,auVar77);
                auVar68 = vroundps_avx(ZEXT1632(auVar79),1);
                auVar175 = vcmpps_avx(ZEXT1632(auVar79),auVar68,1);
                auVar175 = vandps_avx(auVar175,auVar72);
                auVar175 = vsubps_avx(auVar68,auVar175);
                auVar79 = vfmsub231ps_fma(auVar53,auVar175,auVar103);
                auVar102._8_4_ = 0x395e8083;
                auVar102._0_8_ = 0x395e8083395e8083;
                auVar102._12_4_ = 0x395e8083;
                auVar102._16_4_ = 0x395e8083;
                auVar102._20_4_ = 0x395e8083;
                auVar102._24_4_ = 0x395e8083;
                auVar102._28_4_ = 0x395e8083;
                auVar151 = vfmsub231ps_fma(ZEXT1632(auVar79),auVar175,auVar102);
                auVar53 = ZEXT1632(auVar151);
                auVar15._28_4_ = auVar68._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(auVar151._12_4_ * auVar151._12_4_,
                                        CONCAT48(auVar151._8_4_ * auVar151._8_4_,
                                                 CONCAT44(auVar151._4_4_ * auVar151._4_4_,
                                                          auVar151._0_4_ * auVar151._0_4_))));
                auVar79 = vfmadd213ps_fma(auVar74,auVar53,auVar119);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar53,auVar73);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar53,auVar181._0_32_);
                auVar53 = ZEXT1632(auVar151);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar53,auVar140._0_32_);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar53,auVar77);
                auVar61 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar15,auVar53);
                auVar48._0_4_ = (int)auVar175._0_4_;
                auVar48._4_4_ = (int)auVar175._4_4_;
                auVar48._8_4_ = (int)auVar175._8_4_;
                auVar48._12_4_ = (int)auVar175._12_4_;
                auVar54._16_4_ = (int)auVar175._16_4_;
                auVar54._0_16_ = auVar48;
                auVar54._20_4_ = (int)auVar175._20_4_;
                auVar54._24_4_ = (int)auVar175._24_4_;
                auVar54._28_4_ = (int)auVar175._28_4_;
                auVar151 = vpslld_avx(auVar48,0x17);
                auVar79 = vpslld_avx(auVar54._16_16_,0x17);
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar79 = vpaddd_avx(auVar79,auVar80);
                auVar151 = vpaddd_avx(auVar151,auVar80);
                auVar177._16_16_ = auVar79;
                auVar177._0_16_ = auVar151;
                auVar55._0_4_ = auVar61._0_4_ + auVar120._0_4_;
                auVar55._4_4_ = auVar61._4_4_ + auVar120._4_4_;
                auVar55._8_4_ = auVar61._8_4_ + auVar120._8_4_;
                auVar55._12_4_ = auVar61._12_4_ + auVar120._12_4_;
                auVar55._16_4_ = auVar120._16_4_ + 0.0;
                auVar55._20_4_ = auVar120._20_4_ + 0.0;
                auVar55._24_4_ = auVar120._24_4_ + 0.0;
                auVar55._28_4_ = auVar120._28_4_ + 0.0;
                auVar155 = ZEXT864(0) << 0x20;
                auVar79 = vfmadd213ps_fma(auVar177,auVar55,auVar72);
                auVar175 = vrcpps_avx(ZEXT1632(auVar79));
                auVar79 = vfmsub213ps_fma(ZEXT1632(auVar79),auVar175,auVar72);
                auVar79 = vfnmadd132ps_fma(ZEXT1632(auVar79),auVar175,auVar175);
                auVar175 = ZEXT1632(auVar79);
                break;
              case 5:
                auVar164._8_4_ = 0x42b0c0a5;
                auVar164._0_8_ = 0x42b0c0a542b0c0a5;
                auVar164._12_4_ = 0x42b0c0a5;
                auVar164._16_4_ = 0x42b0c0a5;
                auVar164._20_4_ = 0x42b0c0a5;
                auVar164._24_4_ = 0x42b0c0a5;
                auVar164._28_4_ = 0x42b0c0a5;
                auVar175 = vminps_avx(auVar164,auVar53);
                auVar53 = vmaxps_avx(auVar100,auVar175);
                auVar79 = vfmadd213ps_fma(auVar101,auVar53,auVar77);
                auVar68 = vroundps_avx(ZEXT1632(auVar79),1);
                auVar175 = vcmpps_avx(ZEXT1632(auVar79),auVar68,1);
                auVar175 = vandps_avx(auVar175,auVar72);
                auVar175 = vsubps_avx(auVar68,auVar175);
                auVar79 = vfmsub231ps_fma(auVar53,auVar175,auVar103);
                auVar96._8_4_ = 0xb95e8083;
                auVar96._0_8_ = 0xb95e8083b95e8083;
                auVar96._12_4_ = 0xb95e8083;
                auVar96._16_4_ = 0xb95e8083;
                auVar96._20_4_ = 0xb95e8083;
                auVar96._24_4_ = 0xb95e8083;
                auVar96._28_4_ = 0xb95e8083;
                auVar151 = vfnmsub231ps_fma(ZEXT1632(auVar79),auVar175,auVar96);
                auVar67 = ZEXT1632(auVar151);
                auVar53._28_4_ = auVar68._28_4_;
                auVar53._0_28_ =
                     ZEXT1628(CONCAT412(auVar151._12_4_ * auVar151._12_4_,
                                        CONCAT48(auVar151._8_4_ * auVar151._8_4_,
                                                 CONCAT44(auVar151._4_4_ * auVar151._4_4_,
                                                          auVar151._0_4_ * auVar151._0_4_))));
                auVar79 = vfmadd213ps_fma(auVar74,auVar67,auVar119);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar67,auVar73);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar67,auVar181._0_32_);
                auVar68 = ZEXT1632(auVar151);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar68,auVar140._0_32_);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar68,auVar77);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar53,auVar68);
                auVar67._0_4_ = auVar79._0_4_ + auVar120._0_4_;
                auVar67._4_4_ = auVar79._4_4_ + auVar120._4_4_;
                auVar67._8_4_ = auVar79._8_4_ + auVar120._8_4_;
                auVar67._12_4_ = auVar79._12_4_ + auVar120._12_4_;
                auVar67._16_4_ = auVar120._16_4_ + 0.0;
                auVar67._20_4_ = auVar120._20_4_ + 0.0;
                auVar67._24_4_ = auVar120._24_4_ + 0.0;
                auVar67._28_4_ = auVar120._28_4_ + 0.0;
                auVar78._0_4_ = (int)auVar175._0_4_;
                auVar78._4_4_ = (int)auVar175._4_4_;
                auVar78._8_4_ = (int)auVar175._8_4_;
                auVar78._12_4_ = (int)auVar175._12_4_;
                auVar97._16_4_ = (int)auVar175._16_4_;
                auVar97._0_16_ = auVar78;
                auVar97._20_4_ = (int)auVar175._20_4_;
                auVar97._24_4_ = (int)auVar175._24_4_;
                auVar97._28_4_ = (int)auVar175._28_4_;
                auVar151 = vpslld_avx(auVar78,0x17);
                auVar79 = vpslld_avx(auVar97._16_16_,0x17);
                auVar121._8_4_ = 0x3f800000;
                auVar121._0_8_ = 0x3f8000003f800000;
                auVar121._12_4_ = 0x3f800000;
                auVar79 = vpaddd_avx(auVar79,auVar121);
                auVar151 = vpaddd_avx(auVar151,auVar121);
                auVar174._16_16_ = auVar79;
                auVar174._0_16_ = auVar151;
                auVar61 = vfmadd213ps_fma(auVar174,auVar67,auVar72);
                auVar69._8_4_ = 0x800000;
                auVar69._0_8_ = 0x80000000800000;
                auVar69._12_4_ = 0x800000;
                auVar69._16_4_ = 0x800000;
                auVar69._20_4_ = 0x800000;
                auVar69._24_4_ = 0x800000;
                auVar69._28_4_ = 0x800000;
                auVar175 = vmaxps_avx(ZEXT1632(auVar61),auVar69);
                auVar151 = vpsrld_avx(auVar175._0_16_,0x17);
                auVar79 = vpsrld_avx(auVar175._16_16_,0x17);
                auVar117._8_4_ = 0x807fffff;
                auVar117._0_8_ = 0x807fffff807fffff;
                auVar117._12_4_ = 0x807fffff;
                auVar117._16_4_ = 0x807fffff;
                auVar117._20_4_ = 0x807fffff;
                auVar117._24_4_ = 0x807fffff;
                auVar117._28_4_ = 0x807fffff;
                auVar175 = vandps_avx(auVar175,auVar117);
                auVar72 = vorps_avx(auVar175,auVar77);
                auVar118._8_4_ = 0x3f3504f3;
                auVar118._0_8_ = 0x3f3504f33f3504f3;
                auVar118._12_4_ = 0x3f3504f3;
                auVar118._16_4_ = 0x3f3504f3;
                auVar118._20_4_ = 0x3f3504f3;
                auVar118._24_4_ = 0x3f3504f3;
                auVar118._28_4_ = 0x3f3504f3;
                auVar53 = vcmpps_avx(auVar118,auVar72,2);
                auVar175 = vandnps_avx(auVar53,auVar72);
                auVar70._0_4_ = auVar175._0_4_ + auVar72._0_4_ + -1.0;
                auVar70._4_4_ = auVar175._4_4_ + auVar72._4_4_ + -1.0;
                auVar70._8_4_ = auVar175._8_4_ + auVar72._8_4_ + -1.0;
                auVar70._12_4_ = auVar175._12_4_ + auVar72._12_4_ + -1.0;
                auVar70._16_4_ = auVar175._16_4_ + auVar72._16_4_ + -1.0;
                auVar70._20_4_ = auVar175._20_4_ + auVar72._20_4_ + -1.0;
                auVar70._24_4_ = auVar175._24_4_ + auVar72._24_4_ + -1.0;
                auVar70._28_4_ = auVar175._28_4_ + auVar72._28_4_ + -1.0;
                auVar79 = vpsubd_avx(auVar79,auVar53._16_16_);
                auVar156._8_4_ = 0xffffff81;
                auVar156._0_8_ = 0xffffff81ffffff81;
                auVar156._12_4_ = 0xffffff81;
                auVar79 = vpaddd_avx(auVar79,auVar156);
                auVar151 = vpsubd_avx(auVar151,auVar53._0_16_);
                auVar151 = vpaddd_avx(auVar156,auVar151);
                auVar98._16_16_ = auVar79;
                auVar98._0_16_ = auVar151;
                auVar72._4_4_ = auVar70._4_4_ * auVar70._4_4_;
                auVar72._0_4_ = auVar70._0_4_ * auVar70._0_4_;
                auVar72._8_4_ = auVar70._8_4_ * auVar70._8_4_;
                auVar72._12_4_ = auVar70._12_4_ * auVar70._12_4_;
                auVar72._16_4_ = auVar70._16_4_ * auVar70._16_4_;
                auVar72._20_4_ = auVar70._20_4_ * auVar70._20_4_;
                auVar72._24_4_ = auVar70._24_4_ * auVar70._24_4_;
                auVar72._28_4_ = auVar53._28_4_;
                auVar153._8_4_ = 0x3d9021bb;
                auVar153._0_8_ = 0x3d9021bb3d9021bb;
                auVar153._12_4_ = 0x3d9021bb;
                auVar153._16_4_ = 0x3d9021bb;
                auVar153._20_4_ = 0x3d9021bb;
                auVar153._24_4_ = 0x3d9021bb;
                auVar153._28_4_ = 0x3d9021bb;
                auVar130._8_4_ = 0xbdebd1b8;
                auVar130._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar130._12_4_ = 0xbdebd1b8;
                auVar130._16_4_ = 0xbdebd1b8;
                auVar130._20_4_ = 0xbdebd1b8;
                auVar130._24_4_ = 0xbdebd1b8;
                auVar130._28_4_ = 0xbdebd1b8;
                auVar79 = vfmadd213ps_fma(auVar153,auVar70,auVar130);
                auVar131._8_4_ = 0x3def251a;
                auVar131._0_8_ = 0x3def251a3def251a;
                auVar131._12_4_ = 0x3def251a;
                auVar131._16_4_ = 0x3def251a;
                auVar131._20_4_ = 0x3def251a;
                auVar131._24_4_ = 0x3def251a;
                auVar131._28_4_ = 0x3def251a;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar131);
                auVar132._8_4_ = 0xbdfe5d4f;
                auVar132._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar132._12_4_ = 0xbdfe5d4f;
                auVar132._16_4_ = 0xbdfe5d4f;
                auVar132._20_4_ = 0xbdfe5d4f;
                auVar132._24_4_ = 0xbdfe5d4f;
                auVar132._28_4_ = 0xbdfe5d4f;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar132);
                auVar133._8_4_ = 0x3e11e9bf;
                auVar133._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar133._12_4_ = 0x3e11e9bf;
                auVar133._16_4_ = 0x3e11e9bf;
                auVar133._20_4_ = 0x3e11e9bf;
                auVar133._24_4_ = 0x3e11e9bf;
                auVar133._28_4_ = 0x3e11e9bf;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar133);
                auVar134._8_4_ = 0xbe2aae50;
                auVar134._0_8_ = 0xbe2aae50be2aae50;
                auVar134._12_4_ = 0xbe2aae50;
                auVar134._16_4_ = 0xbe2aae50;
                auVar134._20_4_ = 0xbe2aae50;
                auVar134._24_4_ = 0xbe2aae50;
                auVar134._28_4_ = 0xbe2aae50;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar134);
                auVar135._8_4_ = 0x3e4cceac;
                auVar135._0_8_ = 0x3e4cceac3e4cceac;
                auVar135._12_4_ = 0x3e4cceac;
                auVar135._16_4_ = 0x3e4cceac;
                auVar135._20_4_ = 0x3e4cceac;
                auVar135._24_4_ = 0x3e4cceac;
                auVar135._28_4_ = 0x3e4cceac;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar135);
                auVar136._8_4_ = 0xbe7ffffc;
                auVar136._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar136._12_4_ = 0xbe7ffffc;
                auVar136._16_4_ = 0xbe7ffffc;
                auVar136._20_4_ = 0xbe7ffffc;
                auVar136._24_4_ = 0xbe7ffffc;
                auVar136._28_4_ = 0xbe7ffffc;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar136);
                auVar137._8_4_ = 0x3eaaaaaa;
                auVar137._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar137._12_4_ = 0x3eaaaaaa;
                auVar137._16_4_ = 0x3eaaaaaa;
                auVar137._20_4_ = 0x3eaaaaaa;
                auVar137._24_4_ = 0x3eaaaaaa;
                auVar137._28_4_ = 0x3eaaaaaa;
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar70,auVar137);
                auVar154._0_4_ = auVar70._0_4_ * auVar70._0_4_ * auVar70._0_4_ * auVar79._0_4_;
                auVar154._4_4_ = auVar70._4_4_ * auVar70._4_4_ * auVar70._4_4_ * auVar79._4_4_;
                auVar154._8_4_ = auVar70._8_4_ * auVar70._8_4_ * auVar70._8_4_ * auVar79._8_4_;
                auVar154._12_4_ = auVar70._12_4_ * auVar70._12_4_ * auVar70._12_4_ * auVar79._12_4_;
                auVar154._16_4_ = auVar70._16_4_ * auVar70._16_4_ * auVar70._16_4_ * 0.0;
                auVar154._20_4_ = auVar70._20_4_ * auVar70._20_4_ * auVar70._20_4_ * 0.0;
                auVar154._24_4_ = auVar70._24_4_ * auVar70._24_4_ * auVar70._24_4_ * 0.0;
                auVar154._28_4_ = 0;
                auVar169 = ZEXT3264(auVar100);
                auVar170 = ZEXT3264(auVar101);
                auVar172 = ZEXT3264(auVar119);
                auVar150 = ZEXT3264(auVar74);
                auVar143 = ZEXT3264(auVar103);
                auVar144 = ZEXT3264(auVar73);
                auVar107 = ZEXT3264(auVar77);
                auVar180._8_4_ = 0x3d2aa9c1;
                auVar180._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar180._12_4_ = 0x3d2aa9c1;
                auVar180._16_4_ = 0x3d2aa9c1;
                auVar180._20_4_ = 0x3d2aa9c1;
                auVar180._24_4_ = 0x3d2aa9c1;
                auVar180._28_4_ = 0x3d2aa9c1;
                auVar181 = ZEXT3264(auVar180);
                auVar175 = vcvtdq2ps_avx(auVar98);
                auVar165._8_4_ = 0xb95e8083;
                auVar165._0_8_ = 0xb95e8083b95e8083;
                auVar165._12_4_ = 0xb95e8083;
                auVar165._16_4_ = 0xb95e8083;
                auVar165._20_4_ = 0xb95e8083;
                auVar165._24_4_ = 0xb95e8083;
                auVar165._28_4_ = 0xb95e8083;
                auVar79 = vfmadd231ps_fma(auVar154,auVar175,auVar165);
                auVar79 = vfmsub231ps_fma(ZEXT1632(auVar79),auVar77,auVar72);
                auVar53 = vcmpps_avx(ZEXT1632(auVar61),_DAT_004f2e40,2);
                auVar72 = vsubps_avx(ZEXT1632(auVar79),auVar70);
                auVar79 = vfmsub231ps_fma(auVar72,auVar103,auVar175);
                auVar175._8_4_ = 0xc0000000;
                auVar175._0_8_ = 0xc0000000c0000000;
                auVar175._12_4_ = 0xc0000000;
                auVar175._16_4_ = 0xc0000000;
                auVar175._20_4_ = 0xc0000000;
                auVar175._24_4_ = 0xc0000000;
                auVar175._28_4_ = 0xc0000000;
                auVar71._0_4_ = auVar79._0_4_ * -2.0;
                auVar71._4_4_ = auVar79._4_4_ * -2.0;
                auVar71._8_4_ = auVar79._8_4_ * -2.0;
                auVar71._12_4_ = auVar79._12_4_ * -2.0;
                auVar71._16_4_ = 0x80000000;
                auVar71._20_4_ = 0x80000000;
                auVar71._24_4_ = 0x80000000;
                auVar71._28_4_ = 0;
                auVar99._8_4_ = 0x7fffffff;
                auVar99._0_8_ = 0x7fffffff7fffffff;
                auVar99._12_4_ = 0x7fffffff;
                auVar99._16_4_ = 0x7fffffff;
                auVar99._20_4_ = 0x7fffffff;
                auVar99._24_4_ = 0x7fffffff;
                auVar99._28_4_ = 0x7fffffff;
                auVar53 = vblendvps_avx(auVar71,auVar99,auVar53);
                auVar53 = vminps_avx(auVar53,auVar164);
                auVar72 = vmaxps_avx(auVar100,auVar53);
                auVar79 = vfmadd213ps_fma(auVar101,auVar72,auVar77);
                auVar68 = vroundps_avx(ZEXT1632(auVar79),1);
                auVar53 = vcmpps_avx(ZEXT1632(auVar79),auVar68,1);
                auVar138._8_4_ = 0x3f800000;
                auVar138._0_8_ = 0x3f8000003f800000;
                auVar138._12_4_ = 0x3f800000;
                auVar138._16_4_ = 0x3f800000;
                auVar138._20_4_ = 0x3f800000;
                auVar138._24_4_ = 0x3f800000;
                auVar138._28_4_ = 0x3f800000;
                auVar53 = vandps_avx(auVar53,auVar138);
                auVar139._8_4_ = 0x3e2aaaaa;
                auVar139._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar139._12_4_ = 0x3e2aaaaa;
                auVar139._16_4_ = 0x3e2aaaaa;
                auVar139._20_4_ = 0x3e2aaaaa;
                auVar139._24_4_ = 0x3e2aaaaa;
                auVar139._28_4_ = 0x3e2aaaaa;
                auVar140 = ZEXT3264(auVar139);
                auVar53 = vsubps_avx(auVar68,auVar53);
                auVar79 = vfmsub231ps_fma(auVar72,auVar53,auVar103);
                auVar151 = vfnmsub231ps_fma(ZEXT1632(auVar79),auVar53,auVar165);
                auVar72 = ZEXT1632(auVar151);
                auVar68._28_4_ = auVar68._28_4_;
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(auVar151._12_4_ * auVar151._12_4_,
                                        CONCAT48(auVar151._8_4_ * auVar151._8_4_,
                                                 CONCAT44(auVar151._4_4_ * auVar151._4_4_,
                                                          auVar151._0_4_ * auVar151._0_4_))));
                auVar79 = vfmadd213ps_fma(auVar74,auVar72,auVar119);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar72,auVar73);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar72,auVar180);
                auVar72 = ZEXT1632(auVar151);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar72,auVar139);
                auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar72,auVar77);
                auVar61 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar68,auVar72);
                auVar119._8_4_ = 0x3f800000;
                auVar119._0_8_ = 0x3f8000003f800000;
                auVar119._12_4_ = 0x3f800000;
                auVar119._16_4_ = 0x3f800000;
                auVar119._20_4_ = 0x3f800000;
                auVar119._24_4_ = 0x3f800000;
                auVar119._28_4_ = 0x3f800000;
                auVar120 = ZEXT3264(auVar119);
                auVar57._0_4_ = (int)auVar53._0_4_;
                auVar57._4_4_ = (int)auVar53._4_4_;
                auVar57._8_4_ = (int)auVar53._8_4_;
                auVar57._12_4_ = (int)auVar53._12_4_;
                auVar73._16_4_ = (int)auVar53._16_4_;
                auVar73._0_16_ = auVar57;
                auVar73._20_4_ = (int)auVar53._20_4_;
                auVar73._24_4_ = (int)auVar53._24_4_;
                auVar73._28_4_ = (int)auVar53._28_4_;
                auVar151 = vpslld_avx(auVar57,0x17);
                auVar79 = vpslld_avx(auVar73._16_16_,0x17);
                auVar157._8_4_ = 0x3f800000;
                auVar157._0_8_ = 0x3f8000003f800000;
                auVar157._12_4_ = 0x3f800000;
                auVar79 = vpaddd_avx(auVar157,auVar79);
                auVar151 = vpaddd_avx(auVar157,auVar151);
                auVar74._16_16_ = auVar79;
                auVar74._0_16_ = auVar151;
                auVar100._0_4_ = auVar61._0_4_ + 1.0;
                auVar100._4_4_ = auVar61._4_4_ + 1.0;
                auVar100._8_4_ = auVar61._8_4_ + 1.0;
                auVar100._12_4_ = auVar61._12_4_ + 1.0;
                auVar100._16_4_ = 0x3f800000;
                auVar100._20_4_ = 0x3f800000;
                auVar100._24_4_ = 0x3f800000;
                auVar100._28_4_ = 0x3f800000;
                auVar155 = ZEXT864(0) << 0x20;
                auVar79 = vfmadd213ps_fma(auVar74,auVar100,auVar119);
                auVar53 = vrcpps_avx(ZEXT1632(auVar79));
                auVar79 = vfmsub213ps_fma(ZEXT1632(auVar79),auVar53,auVar119);
                auVar79 = vfnmadd132ps_fma(ZEXT1632(auVar79),auVar53,auVar53);
                auVar101._8_4_ = 0xbf800000;
                auVar101._0_8_ = 0xbf800000bf800000;
                auVar101._12_4_ = 0xbf800000;
                auVar101._16_4_ = 0xbf800000;
                auVar101._20_4_ = 0xbf800000;
                auVar101._24_4_ = 0xbf800000;
                auVar101._28_4_ = 0xbf800000;
                auVar79 = vfnmadd213ps_fma(ZEXT1632(auVar79),auVar175,auVar101);
                auVar65 = ZEXT1628(auVar79);
                goto LAB_003db22e;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var24);
                auVar77._4_4_ = uVar1;
                auVar77._0_4_ = uVar1;
                auVar77._8_4_ = uVar1;
                auVar77._12_4_ = uVar1;
                auVar77._16_4_ = uVar1;
                auVar77._20_4_ = uVar1;
                auVar77._24_4_ = uVar1;
                auVar77._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var24))[1];
                auVar103._4_4_ = uVar1;
                auVar103._0_4_ = uVar1;
                auVar103._8_4_ = uVar1;
                auVar103._12_4_ = uVar1;
                auVar103._16_4_ = uVar1;
                auVar103._20_4_ = uVar1;
                auVar103._24_4_ = uVar1;
                auVar103._28_4_ = uVar1;
                auVar79 = vfmadd231ps_fma(auVar103,auVar53,auVar77);
                auVar53 = vmaxps_avx(auVar68,ZEXT1632(auVar79));
                auVar53 = vminps_avx(auVar53,auVar72);
                auVar65 = auVar53._0_28_;
LAB_003db22e:
                auVar16._4_4_ = auVar65._4_4_ * auVar56._4_4_;
                auVar16._0_4_ = auVar65._0_4_ * auVar56._0_4_;
                auVar16._8_4_ = auVar65._8_4_ * auVar56._8_4_;
                auVar16._12_4_ = auVar65._12_4_ * auVar56._12_4_;
                auVar16._16_4_ = auVar65._16_4_ * auVar56._16_4_;
                auVar16._20_4_ = auVar65._20_4_ * auVar56._20_4_;
                auVar16._24_4_ = auVar65._24_4_ * auVar56._24_4_;
                auVar16._28_4_ = auVar175._28_4_;
                auVar175 = auVar16;
              }
switchD_003dae16_caseD_1:
              *(undefined1 (*) [32])ppp_Var30 = auVar175;
              ppp_Var30 = ppp_Var30 + 4;
            }
          }
          pAVar32 = (Allocator *)(ulong)(uint)(iVar18 + iVar19 * 8);
          local_1d0 = pAVar26;
          local_1c8 = pAVar29;
          pAVar44 = (Allocator *)((long)&pAVar26->_vptr_Allocator + 1);
        }
      }
    }
    else {
      uVar41 = (long)iVar18 / (long)iVar19;
      uVar40 = (long)*(int *)(&this->field_0xd0 + (long)p_Var24) / (long)iVar19;
      if (opt->use_packing_layout == true) {
        uVar45 = (uint)((uVar41 & 3) == 0) * 3 + 1;
        if ((uVar41 & 7) == 0) {
          uVar45 = 8;
        }
        uVar23 = (uint)((uVar40 & 3) == 0) * 3 + 1;
        if ((uVar40 & 7) == 0) {
          uVar23 = 8;
        }
      }
      else {
        uVar45 = 1;
        uVar23 = uVar45;
      }
      piVar10 = bottom_blob->refcount;
      local_168.data = bottom_blob->data;
      local_168.refcount = bottom_blob->refcount;
      local_168.elemsize = bottom_blob->elemsize;
      local_168.elempack = bottom_blob->elempack;
      local_168.allocator = bottom_blob->allocator;
      local_168.dims = bottom_blob->dims;
      local_168.w = bottom_blob->w;
      local_168.h = bottom_blob->h;
      local_168.d = bottom_blob->d;
      local_168.c = bottom_blob->c;
      local_168.cstep = bottom_blob->cstep;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      if ((int)uVar45 < iVar9) {
        opt_p.lightmode = opt->lightmode;
        opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_basic = opt->use_subgroup_basic;
        opt_p.use_subgroup_vote = opt->use_subgroup_vote;
        opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_reserved_7 = opt->use_reserved_7;
        opt_p.use_reserved_8 = opt->use_reserved_8;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_168,uVar45,&opt_p);
      }
      sVar11 = local_1d8;
      piVar10 = (int *)CONCAT44(local_218._12_4_,local_218._8_4_);
      opt_p.blob_allocator = (Allocator *)CONCAT44(local_218._12_4_,local_218._8_4_);
      opt_p.lightmode = (bool)local_218[0];
      opt_p._1_3_ = local_218._1_3_;
      opt_p.num_threads = local_218._4_4_;
      opt_p.workspace_allocator = (Allocator *)local_218._16_8_;
      opt_p.openmp_blocktime = local_218._24_4_;
      opt_p.use_bf16_storage = (bool)local_218[0x20];
      opt_p.use_fp16_packed = (bool)local_218[0x21];
      opt_p.use_fp16_storage = (bool)local_218[0x22];
      opt_p.use_fp16_arithmetic = (bool)local_218[0x23];
      opt_p.use_int8_packed = (bool)local_218[0x24];
      opt_p.use_int8_storage = (bool)local_218[0x25];
      opt_p.use_int8_arithmetic = (bool)local_218[0x26];
      opt_p.use_packing_layout = (bool)local_218[0x27];
      opt_p._44_4_ = local_218._44_4_;
      opt_p._40_4_ = local_218._40_4_;
      opt_p.flush_denormals = local_218._48_4_;
      opt_p.use_local_pool_allocator = (bool)local_218[0x34];
      opt_p.use_shader_local_memory = (bool)local_218[0x35];
      opt_p.use_cooperative_matrix = (bool)local_218[0x36];
      opt_p.use_winograd23_convolution = (bool)local_218[0x37];
      opt_p.use_winograd43_convolution = (bool)(undefined1)local_1e0;
      opt_p.use_winograd63_convolution = (bool)local_1e0._1_1_;
      opt_p.use_a53_a55_optimized_kernel = (bool)local_1e0._2_1_;
      opt_p.use_reserved_7 = (bool)local_1e0._3_1_;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      if ((uVar23 < uVar36) &&
         ((Mat::create((Mat *)&opt_p,_w,_h,
                       *(int *)(&this->field_0xd0 +
                               (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]) / (int)uVar23,
                       (ulong)uVar23 * (sVar39 / uVar36),uVar23,opt->workspace_allocator),
          opt_p._0_8_ == 0 || ((long)(int)opt_p._56_4_ * sVar11 == 0)))) {
        iVar34 = -100;
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
        if (local_168.refcount != (int *)0x0) {
          LOCK();
          *local_168.refcount = *local_168.refcount + -1;
          UNLOCK();
          if (*local_168.refcount == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_003dc28e;
      }
      iVar42 = 0;
      iVar34 = 0;
      for (lVar35 = 0;
          lVar35 < *(int *)(&this->field_0x114 +
                           (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]);
          lVar35 = lVar35 + 1) {
        m.c = (int)uVar41 / (int)uVar45;
        m.data = (void *)((long)(iVar42 / (int)uVar45) * local_168.cstep * local_168.elemsize +
                         (long)local_168.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_168.elemsize;
        m.elempack = local_168.elempack;
        m.allocator = local_168.allocator;
        m.cstep = ((long)local_168.d * local_168.elemsize * (long)local_168.h * (long)local_168.w +
                   0xf & 0xfffffffffffffff0) / local_168.elemsize;
        m.dims = local_168.dims;
        m.w = local_168.w;
        m.h = local_168.h;
        m.d = local_168.d;
        m_1.c = (int)uVar40 / (int)uVar23;
        m_1.data = (void *)((long)(iVar34 / (int)uVar23) * sVar11 * (long)opt_p.workspace_allocator
                           + opt_p._0_8_);
        m_1.refcount = (int *)0x0;
        m_1.elemsize = (size_t)opt_p.workspace_allocator;
        m_1.elempack = opt_p.openmp_blocktime;
        m_1.allocator = (Allocator *)opt_p._32_8_;
        m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                     (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
        m_1._40_8_ = opt_p._40_8_;
        m_1._48_8_ = opt_p._48_8_;
        pLVar14 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar35];
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
        (*pLVar14->_vptr_Layer[7])(pLVar14,&m,&m_1,&opt_g);
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = iVar34 + (int)uVar40;
        iVar42 = iVar42 + (int)uVar41;
      }
      if (uVar23 < uVar36) {
        convert_packing((Mat *)&opt_p,(Mat *)local_218,uVar36,opt);
      }
      else {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar10 = (int *)CONCAT44(local_218._12_4_,local_218._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if ((Allocator *)local_218._32_8_ == (Allocator *)0x0) {
              free((void *)local_218._0_8_);
            }
            else {
              (*(*(_func_int ***)local_218._32_8_)[3])();
            }
          }
        }
        uVar17 = opt_p._56_8_;
        local_218[0] = opt_p.lightmode;
        local_218._1_3_ = opt_p._1_3_;
        local_218._4_4_ = opt_p.num_threads;
        local_218._8_4_ = SUB84(opt_p.blob_allocator,0);
        local_218._12_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
        local_218._16_8_ = opt_p.workspace_allocator;
        local_218._24_4_ = opt_p.openmp_blocktime;
        local_218[0x20] = opt_p.use_bf16_storage;
        local_218[0x21] = opt_p.use_fp16_packed;
        local_218[0x22] = opt_p.use_fp16_storage;
        local_218[0x23] = opt_p.use_fp16_arithmetic;
        local_218[0x24] = opt_p.use_int8_packed;
        local_218[0x25] = opt_p.use_int8_storage;
        local_218[0x26] = opt_p.use_int8_arithmetic;
        local_218[0x27] = opt_p.use_packing_layout;
        local_218._40_4_ = opt_p._40_4_;
        local_218._44_4_ = opt_p._44_4_;
        local_218._48_4_ = opt_p.flush_denormals;
        local_218[0x34] = opt_p.use_local_pool_allocator;
        local_218[0x35] = opt_p.use_shader_local_memory;
        local_218[0x36] = opt_p.use_cooperative_matrix;
        local_218[0x37] = opt_p.use_winograd23_convolution;
        local_1e0._0_1_ = opt_p.use_winograd43_convolution;
        local_1e0._1_1_ = opt_p.use_winograd63_convolution;
        local_1e0._2_1_ = opt_p.use_a53_a55_optimized_kernel;
        local_1e0._3_1_ = opt_p.use_reserved_7;
        local_1d8 = sVar11;
        opt_p._56_8_ = uVar17;
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_fma +
               (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]),(Mat *)local_218,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && (iVar34 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_003dc28e;
  }
  iVar34 = -100;
LAB_003dc28e:
  piVar10 = (int *)CONCAT44(local_218._12_4_,local_218._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_218._32_8_ == (Allocator *)0x0) {
        free((void *)local_218._0_8_);
      }
      else {
        (*(*(_func_int ***)local_218._32_8_)[3])();
      }
    }
  }
  return iVar34;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}